

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_exp2anyreg(FuncState *fs,expdesc *e)

{
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  if (e->k == VNONRELOC) {
    if (e->t == e->f) {
      return (e->u).info;
    }
    if ((int)(uint)fs->nactvar <= (e->u).info) {
      exp2reg(fs,e,(e->u).info);
      return (e->u).info;
    }
  }
  luaK_exp2nextreg(fs,e);
  return (e->u).info;
}

Assistant:

int luaK_exp2anyreg(FuncState *fs, expdesc *e) {
    luaK_dischargevars(fs, e);
    if (e->k == VNONRELOC) {  /* expression already has a register? */
        if (!hasjumps(e))  /* no jumps? */
            return e->u.info;  /* result is already in a register */
        if (e->u.info >= fs->nactvar) {  /* reg. is not a local? */
            exp2reg(fs, e, e->u.info);  /* put final result in it */
            return e->u.info;
        }
    }
    luaK_exp2nextreg(fs, e);  /* otherwise, use next available register */
    return e->u.info;
}